

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<15>::PartialDistribution::PartialDistribution
          (PartialDistribution *this,Probability *probability,Distribution *spectrum)

{
  double dVar1;
  pointer plVar2;
  pointer pdVar3;
  pointer pOVar4;
  
  *(undefined8 *)
   &(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> =
       *(undefined8 *)
        &(probability->super_TabulationRecord).super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(probability->super_TabulationRecord).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(probability->super_TabulationRecord).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar1 = (probability->super_TabulationRecord).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       ((_Head_base<2UL,_long,_false> *)
       ((long)&(probability->super_TabulationRecord).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl = dVar1;
  (this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (probability->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  plVar2 = (probability->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (probability->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       plVar2;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       (probability->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (probability->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (probability->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (probability->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  plVar2 = (probability->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (this->probability_).super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (probability->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 8) = plVar2;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       (probability->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (probability->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (probability->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (probability->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  pdVar3 = (probability->super_TabulationRecord).xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->probability_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (probability->super_TabulationRecord).xValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  (this->probability_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       pdVar3;
  (this->probability_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (probability->super_TabulationRecord).xValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (probability->super_TabulationRecord).xValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (probability->super_TabulationRecord).xValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (probability->super_TabulationRecord).xValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar3 = (probability->super_TabulationRecord).yValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->probability_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (probability->super_TabulationRecord).yValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  (this->probability_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       pdVar3;
  (this->probability_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (probability->super_TabulationRecord).yValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (probability->super_TabulationRecord).yValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (probability->super_TabulationRecord).yValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (probability->super_TabulationRecord).yValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   &(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> =
       *(undefined8 *)
        &(spectrum->data_).interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar1 = ((_Head_base<1UL,_double,_false> *)
          ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       ((_Head_base<2UL,_long,_false> *)
       ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       dVar1;
  ((_Head_base<0UL,_double,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x28))->_M_head_impl =
       (spectrum->data_).interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  plVar2 = *(pointer *)
            ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            + 8);
  (this->distribution_).data_.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (spectrum->data_).interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) = plVar2;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10) =
       *(pointer *)
        ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data +
        0x10);
  *(pointer *)
   ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  (spectrum->data_).interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  plVar2 = *(pointer *)
            ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.
                    interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  (this->distribution_).data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (spectrum->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) =
       plVar2;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10
   ) = *(pointer *)
        ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data +
        0x10);
  *(pointer *)
   ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  (spectrum->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(spectrum->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  pOVar4 = (spectrum->data_).sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->distribution_).data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (spectrum->data_).sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->distribution_).data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = pOVar4;
  (this->distribution_).data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (spectrum->data_).sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (spectrum->data_).sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (spectrum->data_).sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (spectrum->data_).sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  verifyLF((int)((_Head_base<3UL,_long,_false> *)
                ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata
                        .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->
                _M_head_impl,1);
  return;
}

Assistant:

PartialDistribution( Probability&& probability,
                     Distribution&& spectrum ) :
  probability_( std::move( probability ) ),
  distribution_( std::move( spectrum ) ) {

  verifyLF( this->probability_.LF(),
            this->distribution_.LF() );
}